

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddNestedExtensions<google::protobuf::DescriptorProto>
          (DescriptorIndex *this,StringPiece filename,DescriptorProto *message_type)

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  bool bVar4;
  void **ppvVar5;
  long lVar6;
  
  pRVar2 = (message_type->nested_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  iVar1 = (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar6 = 0;
  do {
    if ((long)iVar1 * 8 == lVar6) {
      pRVar2 = (message_type->extension_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      iVar1 = (message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
      lVar6 = 0;
      do {
        bVar3 = (long)iVar1 * 8 == lVar6;
        if (bVar3) {
          return bVar3;
        }
        bVar4 = AddExtension<google::protobuf::FieldDescriptorProto>
                          (this,filename,*(FieldDescriptorProto **)((long)ppvVar5 + lVar6));
        lVar6 = lVar6 + 8;
      } while (bVar4);
      return bVar3;
    }
    bVar3 = AddNestedExtensions<google::protobuf::DescriptorProto>
                      (this,filename,*(DescriptorProto **)((long)ppvVar5 + lVar6));
    lVar6 = lVar6 + 8;
  } while (bVar3);
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddNestedExtensions(
    StringPiece filename, const DescProto& message_type) {
  for (const auto& nested_type : message_type.nested_type()) {
    if (!AddNestedExtensions(filename, nested_type)) return false;
  }
  for (const auto& extension : message_type.extension()) {
    if (!AddExtension(filename, extension)) return false;
  }
  return true;
}